

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O2

void __thiscall EnrichableI2cAnalyzer::GetByte(EnrichableI2cAnalyzer *this)

{
  pointer puVar1;
  EnrichableAnalyzerSubprocess *this_00;
  bool bVar2;
  bool bVar3;
  U64 UVar4;
  U64 packetId;
  int iVar5;
  Channel *pCVar6;
  ulong uVar7;
  pointer pMVar8;
  int iVar9;
  ulong uVar10;
  U64 potential_ending_sample;
  DataBuilder byte;
  BitState ack_bit_state;
  U64 local_88;
  U64 scl_rising_edge_1;
  U64 local_78;
  ulong local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined1 local_5f;
  BitState bit_state;
  pointer local_50;
  U64 value;
  U64 scl_rising_edge;
  
  puVar1 = (this->mArrowLocataions).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mArrowLocataions).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->mArrowLocataions).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  DataBuilder::DataBuilder(&byte);
  DataBuilder::Reset((ulonglong *)&byte,(ShiftOrder)&value,0);
  potential_ending_sample = 0;
  local_88 = 0;
  iVar9 = 8;
  while (iVar5 = iVar9 + -1, iVar9 != 0) {
    bVar2 = GetBitPartOne(this,&bit_state,&scl_rising_edge_1,&potential_ending_sample);
    bVar3 = GetBitPartTwo(this);
    if (!bVar2 || !bVar3) goto LAB_00109548;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              (&this->mArrowLocataions,&scl_rising_edge_1);
    DataBuilder::AddBit((BitState)&byte);
    bVar2 = iVar9 == 8;
    iVar9 = iVar5;
    if (bVar2) {
      local_88 = scl_rising_edge_1;
    }
  }
  UVar4 = AnalyzerChannelData::GetSampleNumber();
  bVar2 = GetBitPartOne(this,&ack_bit_state,&scl_rising_edge,&potential_ending_sample);
  Frame::Frame((Frame *)&scl_rising_edge_1);
  scl_rising_edge_1 = local_88;
  local_68 = 0;
  local_78 = UVar4;
  if (bVar2) {
    local_78 = potential_ending_sample;
  }
  local_70 = (ulong)(byte)value;
  if (!bVar2) {
    local_5f = 2;
    local_60 = 1;
  }
  else {
    local_5f = 1;
    if (ack_bit_state == BIT_HIGH) {
      local_5f = 0x40;
    }
    local_60 = 1;
    if ((bVar2 & this->mNeedAddress) == 1) {
      this->mNeedAddress = false;
      local_60 = 0;
    }
  }
  UVar4 = AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  uVar10 = (ulong)((long)(this->mArrowLocataions).
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mArrowLocataions).
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3;
  for (uVar7 = 0; (uVar10 & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,
               (MarkerType)
               (this->mArrowLocataions).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7],(Channel *)0x4);
  }
  bVar2 = EnrichableAnalyzerSubprocess::MarkerEnabled((this->mSubprocess)._M_ptr);
  if (bVar2) {
    this_00 = (this->mSubprocess)._M_ptr;
    packetId = AnalyzerResults::GetNumPackets();
    EnrichableAnalyzerSubprocess::EmitMarker
              ((vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                *)&bit_state,this_00,packetId,UVar4,(Frame *)&scl_rising_edge_1,(U32)uVar10);
    pCVar6 = (Channel *)0x0;
    for (pMVar8 = _bit_state; pMVar8 != local_50; pMVar8 = pMVar8 + 1) {
      bVar2 = std::operator==(&pMVar8->channelName,"sda");
      if (bVar2) {
        pCVar6 = &((this->mSettings)._M_ptr)->mSdaChannel;
LAB_001094c7:
        AnalyzerResults::AddMarker
                  ((ulonglong)(this->mResults)._M_ptr,
                   (MarkerType)
                   (this->mArrowLocataions).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[pMVar8->sampleNumber],
                   (Channel *)(ulong)pMVar8->markerType);
      }
      else {
        if (pCVar6 != (Channel *)0x0) goto LAB_001094c7;
        std::operator<<((ostream *)&std::cerr,"Received marker request for invalid marker: ");
        std::operator<<((ostream *)&std::cerr,(string *)&pMVar8->channelName);
        std::operator<<((ostream *)&std::cerr," ignoring.\n");
        pCVar6 = (Channel *)0x0;
      }
    }
    std::
    vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
    ::~vector((vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
               *)&bit_state);
  }
  AnalyzerResults::CommitResults();
  GetBitPartTwo(this);
  Frame::~Frame((Frame *)&scl_rising_edge_1);
LAB_00109548:
  DataBuilder::~DataBuilder(&byte);
  return;
}

Assistant:

void EnrichableI2cAnalyzer::GetByte()
{
	mArrowLocataions.clear();
	U64 value;
	DataBuilder byte;
	byte.Reset( &value, AnalyzerEnums::MsbFirst, 8 );
	U64 starting_stample = 0;
	U64 potential_ending_sample = 0;
	
	for( U32 i=0; i<8; i++ )
	{
		BitState bit_state;
		U64 scl_rising_edge;
		bool result = GetBitPartOne( bit_state, scl_rising_edge, potential_ending_sample );
		result &= GetBitPartTwo();
		if( result == true )
		{
			mArrowLocataions.push_back( scl_rising_edge );
			byte.AddBit( bit_state );

			if( i == 0 )
				starting_stample = scl_rising_edge;
		}else
		{
			return;
		}
	}

	BitState ack_bit_state;
	U64 scl_rising_edge;
	S64 last_valid_sample = mScl->GetSampleNumber();
	bool result = GetBitPartOne( ack_bit_state, scl_rising_edge, potential_ending_sample );//GetBit( ack_bit_state, scl_rising_edge );
	
	Frame frame;
	frame.mStartingSampleInclusive = starting_stample;
	frame.mEndingSampleInclusive = result ? potential_ending_sample : last_valid_sample;
	frame.mData1 = U8( value );
	frame.mData2 = U8( 0 );

	if( !result )
		frame.mFlags = I2C_MISSING_FLAG_ACK;
	else if( ack_bit_state == BIT_HIGH )
		frame.mFlags = DISPLAY_AS_WARNING_FLAG;
	else
		frame.mFlags = I2C_FLAG_ACK;

	if( mNeedAddress == true && result == true ) //if result is false, then we have already recorded a stop bit and toggled mNeedAddress
	{
		mNeedAddress = false;
		frame.mType = I2cAddress;
	}else
	{
		frame.mType = I2cData;
	}
	U64 frameIndex = mResults->AddFrame( frame );

	U32 count = mArrowLocataions.size();
	for( U32 i=0; i<count; i++ )
		mResults->AddMarker( mArrowLocataions[i], AnalyzerResults::UpArrow, mSettings->mSclChannel );

	if(mSubprocess->MarkerEnabled()) {
		std::vector<EnrichableAnalyzerSubprocess::Marker> markers = mSubprocess->EmitMarker(
			mResults->GetNumPackets(),
			frameIndex,
			frame,
			count
		);

		Channel* channel = NULL;
		for(const EnrichableAnalyzerSubprocess::Marker& marker : markers) {
			if(marker.channelName == "sda") {
				channel = &mSettings->mSdaChannel;
			}
			if(channel != NULL) {
				mResults->AddMarker(
					mArrowLocataions[marker.sampleNumber],
					marker.markerType,
					*channel
				);
			} else {
				std::cerr << "Received marker request for invalid marker: ";
				std::cerr << marker.channelName;
				std::cerr << " ignoring.\n";
			}
		}
	}

	mResults->CommitResults();

	result &= GetBitPartTwo();
}